

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O2

O3DGCErrorCode
o3dgc::LoadUIntAC(Vector<long> *data,unsigned_long M,BinaryStream *bstream,unsigned_long *iterator)

{
  unsigned_long uVar1;
  uchar *puVar2;
  uint uVar3;
  unsigned_long uVar4;
  unsigned_long size;
  unsigned_long uVar5;
  bool bVar6;
  Arithmetic_Codec acd;
  Adaptive_Data_Model mModelValues;
  long local_a0;
  Arithmetic_Codec local_98;
  Adaptive_Data_Model local_68;
  
  uVar4 = BinaryStream::ReadUInt32Bin(bstream,iterator);
  size = BinaryStream::ReadUInt32Bin(bstream,iterator);
  if (size != 0) {
    uVar5 = BinaryStream::ReadUInt32Bin(bstream,iterator);
    uVar1 = *iterator;
    puVar2 = (bstream->m_stream).m_buffer;
    *iterator = (uVar1 + uVar4) - 0xc;
    Vector<long>::Allocate(data,size);
    Arithmetic_Codec::Arithmetic_Codec(&local_98);
    Arithmetic_Codec::set_buffer(&local_98,(int)uVar4 - 0xc,puVar2 + uVar1);
    Arithmetic_Codec::start_decoder(&local_98);
    Adaptive_Data_Model::Adaptive_Data_Model(&local_68,(int)M + 1);
    while (bVar6 = size != 0, size = size - 1, bVar6) {
      uVar3 = Arithmetic_Codec::decode(&local_98,&local_68);
      local_a0 = uVar3 + uVar5;
      Vector<long>::PushBack(data,&local_a0);
    }
    Adaptive_Data_Model::~Adaptive_Data_Model(&local_68);
    Arithmetic_Codec::~Arithmetic_Codec(&local_98);
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    LoadUIntAC(Vector<long> & data,
                                 const unsigned long M,
                                 const BinaryStream & bstream,
                                 unsigned long & iterator) 
    {
        unsigned long sizeSize = bstream.ReadUInt32Bin(iterator) - 12;
        unsigned long size     = bstream.ReadUInt32Bin(iterator);
        if (size == 0)
        {
            return O3DGC_OK;
        }
        long minValue   = bstream.ReadUInt32Bin(iterator);
        unsigned char * buffer = 0;
        bstream.GetBuffer(iterator, buffer);
        iterator += sizeSize;
        data.Allocate(size);
        Arithmetic_Codec acd;
        acd.set_buffer(sizeSize, buffer);
        acd.start_decoder();
        Adaptive_Data_Model mModelValues(M+1);
#ifdef DEBUG_VERBOSE
        printf("-----------\nsize %i\n", size);
        fprintf(g_fileDebugTF, "size %i\n", size);
#endif //DEBUG_VERBOSE
        for(unsigned long i = 0; i < size; ++i)
        {
            data.PushBack(acd.decode(mModelValues)+minValue);
#ifdef DEBUG_VERBOSE
            printf("%i\t%i\n", i, data[i]);
            fprintf(g_fileDebugTF, "%i\t%i\n", i, data[i]);
#endif //DEBUG_VERBOSE
        }
        return O3DGC_OK;
    }